

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O0

int h264_mb_qp_delta(bitstream *str,h264_cabac_context *cabac,int32_t *val)

{
  int iVar1;
  uint local_38 [2];
  uint32_t tmp;
  int ctxIdx [3];
  int32_t *val_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  ctxIdx._4_8_ = val;
  if (cabac == (h264_cabac_context *)0x0) {
    str_local._4_4_ = vs_se(str,val);
  }
  else {
    if ((cabac->slice->prev_mb_addr == 0xffffffff) ||
       (cabac->slice->mbs[cabac->slice->prev_mb_addr].mb_qp_delta == 0)) {
      local_38[1] = 0x3c;
    }
    else {
      local_38[1] = 0x3d;
    }
    tmp = 0x3e;
    ctxIdx[0] = 0x3f;
    if (str->dir == VS_ENCODE) {
      if (*val < 1) {
        local_38[0] = *val * -2;
      }
      else {
        local_38[0] = *val * 2 - 1;
      }
    }
    iVar1 = h264_cabac_tu(str,cabac,(int *)(local_38 + 1),3,0xffffffff,local_38);
    if (iVar1 == 0) {
      if (str->dir == VS_DECODE) {
        if ((local_38[0] & 1) == 0) {
          *(uint *)ctxIdx._4_8_ = -(local_38[0] >> 1);
        }
        else {
          *(uint *)ctxIdx._4_8_ = local_38[0] + 1 >> 1;
        }
      }
      str_local._4_4_ = 0;
    }
    else {
      str_local._4_4_ = 1;
    }
  }
  return str_local._4_4_;
}

Assistant:

int h264_mb_qp_delta(struct bitstream *str, struct h264_cabac_context *cabac, int32_t *val) {
	if (!cabac)
		return vs_se(str, val);
	int ctxIdx[3];
	if (cabac->slice->prev_mb_addr != (uint32_t)-1 && cabac->slice->mbs[cabac->slice->prev_mb_addr].mb_qp_delta)
		ctxIdx[0] = H264_CABAC_CTXIDX_MB_QP_DELTA + 1;
	else
		ctxIdx[0] = H264_CABAC_CTXIDX_MB_QP_DELTA + 0;
	ctxIdx[1] = H264_CABAC_CTXIDX_MB_QP_DELTA + 2;
	ctxIdx[2] = H264_CABAC_CTXIDX_MB_QP_DELTA + 3;
	uint32_t tmp;
	if (str->dir == VS_ENCODE) {
		if (*val > 0) {
			tmp = *val * 2 - 1;
		} else {
			tmp = -*val * 2;
		}
	}
	if (h264_cabac_tu(str, cabac, ctxIdx, 3, -1, &tmp)) return 1;
	if (str->dir == VS_DECODE) {
		if (tmp & 1) {
			*val = (tmp + 1) >> 1;
		} else {
			*val = -(tmp >> 1);
		}
	}
	return 0;
}